

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

int lws_service_flag_pending(lws_context *context,int tsi)

{
  ushort uVar1;
  lws_dll2 *plVar2;
  pollfd *ppVar3;
  uint uVar4;
  lws_dll2 *plVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  
  if (context == (lws_context *)0x0) {
    return 1;
  }
  plVar5 = (lws_dll2 *)(context->pt + tsi);
  do {
    plVar5 = plVar5->next;
    if (plVar5 == (lws_dll2 *)0x0) {
      uVar8 = 0;
      break;
    }
  } while ((*(char *)&plVar5[0x18].owner != '\0') ||
          (uVar8 = 1, *(short *)((long)&plVar5[0x16].next + 4) == 0x110));
  uVar4 = rops_service_flag_pending_ws(context,tsi);
  plVar5 = context->pt[tsi].tls.dll_pending_tls_owner.head;
  uVar8 = uVar4 | uVar8;
  while (plVar5 != (lws_dll2 *)0x0) {
    plVar2 = plVar5->next;
    lVar6 = (long)*(int *)((long)&plVar5[4].prev + 4);
    plVar5 = plVar2;
    if (-1 < lVar6) {
      ppVar3 = context->pt[tsi].fds;
      uVar7 = ppVar3[lVar6].events & 1;
      uVar1 = ppVar3[lVar6].revents;
      ppVar3[lVar6].revents = uVar7 | uVar1;
      if (uVar7 != 0 || (uVar1 & 1) != 0) {
        uVar8 = 1;
      }
    }
  }
  return uVar8;
}

Assistant:

int
lws_service_flag_pending(struct lws_context *context, int tsi)
{
	struct lws_context_per_thread *pt;
	int forced = 0;

	if (!context)
		return 1;

	pt = &context->pt[tsi];

	lws_pt_lock(pt, __func__);

	/*
	 * 1) If there is any wsi with a buflist and in a state to process
	 *    it, we should not wait in poll
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		if (!lws_is_flowcontrolled(wsi) &&
		     lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			forced = 1;
			break;
		}
	} lws_end_foreach_dll(d);

#if defined(LWS_ROLE_WS)
	forced |= lws_rops_func_fidx(&role_ops_ws,
				     LWS_ROPS_service_flag_pending).
					service_flag_pending(context, tsi);
#endif

#if defined(LWS_WITH_TLS)
	/*
	 * 2) For all guys with buffered SSL read data already saved up, if they
	 * are not flowcontrolled, fake their POLLIN status so they'll get
	 * service to use up the buffered incoming data, even though their
	 * network socket may have nothing
	 */
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
			lws_dll2_get_head(&pt->tls.dll_pending_tls_owner)) {
		struct lws *wsi = lws_container_of(p, struct lws,
						   tls.dll_pending_tls);

		if (wsi->position_in_fds_table >= 0) {

			pt->fds[wsi->position_in_fds_table].revents = (short)(
					pt->fds[wsi->position_in_fds_table].revents |
				(pt->fds[wsi->position_in_fds_table].events &
								LWS_POLLIN));
			if (pt->fds[wsi->position_in_fds_table].revents &
								LWS_POLLIN)
				/*
				 * We're not going to remove the wsi from the
				 * pending tls list.  The processing will have
				 * to do it if he exhausts the pending tls.
				 */
				forced = 1;
		}

	} lws_end_foreach_dll_safe(p, p1);
#endif

	lws_pt_unlock(pt);

	return forced;
}